

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
::reserve(vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
          *this,size_t n)

{
  memory_resource *pmVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  int i;
  ulong uVar4;
  
  if (this->nAlloc < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n << 5,8);
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < this->nStored; uVar4 = uVar4 + 1) {
      vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 ((long)&(((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          CONCAT44(extraout_var,iVar2))->alloc).memoryResource + lVar3),
                 (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 ((long)&(this->ptr->alloc).memoryResource + lVar3));
      vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                 ((long)&(this->ptr->alloc).memoryResource + lVar3));
      lVar3 = lVar3 + 0x20;
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 5,8);
    this->nAlloc = n;
    this->ptr = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }